

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::genRandomTest
               (Random *rng,BlendState *preCommon,BlendState *postCommon,
               vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *drawBuffers,int maxDrawBufferCount,Context *context)

{
  bool *pbVar1;
  ContextType ctxType;
  deUint32 dVar2;
  uint uVar3;
  TextureFormat TVar4;
  bool bVar5;
  float fVar6;
  TextureFormat format;
  IVec2 size;
  BlendState blendState;
  DrawBufferInfo local_b0;
  
  genRandomBlendState(rng,preCommon);
  genRandomBlendState(rng,postCommon);
  if (maxDrawBufferCount < 1) {
    maxDrawBufferCount = 0;
  }
  do {
    bVar5 = maxDrawBufferCount == 0;
    maxDrawBufferCount = maxDrawBufferCount + -1;
    if (bVar5) {
      return;
    }
    fVar6 = deRandom_getFloat(&rng->m_rnd);
    size.m_data[0] = 0x40;
    size.m_data[1] = 0x40;
    ctxType.super_ApiType.m_bits = (ApiType)(*context->m_renderCtx->_vptr_RenderContext[2])();
    bVar5 = glu::contextSupports(ctxType,(ApiType)0x23);
    dVar2 = deRandom_getUint32(&rng->m_rnd);
    if (bVar5) {
      uVar3 = dVar2 & 0x1f;
    }
    else {
      uVar3 = dVar2 % 0x1b;
    }
    TVar4 = glu::mapGLInternalFormat(*(deUint32 *)(&DAT_018dfd20 + (ulong)uVar3 * 4));
    blendState.enableBlend.m_ptr = (bool *)0x0;
    blendState.blendEq.m_ptr =
         (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
         0x0;
    blendState.blendFunc.m_ptr =
         (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
          *)0x0;
    blendState.colorMask.m_ptr = (Vector<bool,_4> *)0x0;
    format = TVar4;
    genRandomBlendState(rng,&blendState);
    if (TVar4.type == FLOAT) {
      pbVar1 = (postCommon->enableBlend).m_ptr;
      if (pbVar1 == (bool *)0x0) {
LAB_013ac8f6:
        pbVar1 = (preCommon->enableBlend).m_ptr;
        if (((pbVar1 != (bool *)0x0) && (*pbVar1 != false)) ||
           (blendState.enableBlend.m_ptr != (bool *)0x0)) {
          blendState.enableBlend.field_1.m_data[0] = (deUint8  [1])'\0';
          blendState.enableBlend.m_ptr = (bool *)&blendState.enableBlend.field_1;
        }
      }
      else if (*pbVar1 == true) {
        bVar5 = de::Random::getBool(rng);
        if (bVar5) {
          (postCommon->enableBlend).m_ptr = (bool *)0x0;
          goto LAB_013ac8f6;
        }
        (postCommon->enableBlend).field_1.m_data[0] = '\0';
        (postCommon->enableBlend).m_ptr = (bool *)&(postCommon->enableBlend).field_1;
      }
    }
    DrawBufferInfo::DrawBufferInfo(&local_b0,0.1 < fVar6,&size,&blendState,&format);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back(drawBuffers,&local_b0);
    BlendState::~BlendState(&local_b0.m_blendState);
    BlendState::~BlendState(&blendState);
  } while( true );
}

Assistant:

void genRandomTest (de::Random& rng, BlendState& preCommon, BlendState& postCommon, vector<DrawBufferInfo>& drawBuffers, int maxDrawBufferCount, Context& context)
{
	genRandomBlendState(rng, preCommon);
	genRandomBlendState(rng, postCommon);

	for (int drawBufferNdx = 0; drawBufferNdx < maxDrawBufferCount; drawBufferNdx++)
	{
		const bool			render		= rng.getFloat() > 0.1f;
		const IVec2			size		(64, 64);
		const TextureFormat	format		(getRandomFormat(rng, context));
		BlendState			blendState;

		genRandomBlendState(rng, blendState);

		// 32bit float formats don't support blending in GLES32
		if (format.type == tcu::TextureFormat::FLOAT)
		{
			// If format is 32bit float post common can't enable blending
			if (postCommon.enableBlend && *postCommon.enableBlend)
			{
				// Either don't set enable blend or disable blending
				if (rng.getBool())
					postCommon.enableBlend = tcu::nothing<bool>();
				else
					postCommon.enableBlend = tcu::just(false);
			}

			// If post common doesn't disable blending, per attachment state or
			// pre common must.
			if (!postCommon.enableBlend)
			{
				// If pre common enables blend per attachment must disable it
				// If per attachment state changes blend state it must disable it
				if ((preCommon.enableBlend && *preCommon.enableBlend)
					|| blendState.enableBlend)
					blendState.enableBlend = tcu::just(false);
			}
		}

		drawBuffers.push_back(DrawBufferInfo(render, size, blendState, format));
	}
}